

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_has_no_value_exception::~option_has_no_value_exception
          (option_has_no_value_exception *this)

{
  option_has_no_value_exception *this_local;
  
  ~option_has_no_value_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit option_has_no_value_exception(const std::string& option)
    : OptionException(
        !option.empty() ?
        ("Option " + LQUOTE + option + RQUOTE + " has no value") :
        "Option has no value")
    {
    }